

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

bool wasm::DataFlow::allInputsConstant(Node *node)

{
  Id IVar1;
  pointer ppNVar2;
  pointer ppNVar3;
  bool bVar4;
  Node *pNVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (node->type != Expr) {
    if (node->type != Phi) {
      return false;
    }
    ppNVar2 = (node->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(node->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar2 >> 3;
    if (uVar6 < 2) {
      return true;
    }
    uVar7 = 1;
    uVar8 = 2;
    while (uVar7 < uVar6) {
      pNVar5 = ppNVar2[uVar7];
      if (pNVar5->type != Expr) {
        return false;
      }
      if (((pNVar5->field_1).expr)->_id != ConstId) {
        return false;
      }
      bVar4 = uVar6 <= uVar8;
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
      if (bVar4) {
        return true;
      }
    }
    goto LAB_006bbbc9;
  }
  IVar1 = ((node->field_1).expr)->_id;
  if (IVar1 == SelectId) {
    ppNVar2 = (node->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppNVar3 = (node->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar6 = (long)ppNVar3 - (long)ppNVar2 >> 3;
    if (ppNVar3 == ppNVar2) {
LAB_006bbbd0:
      uVar7 = 0;
      goto LAB_006bbbc9;
    }
    if ((*ppNVar2)->type != Expr) {
      return false;
    }
    if ((((*ppNVar2)->field_1).expr)->_id != ConstId) {
      return false;
    }
    if (1 < uVar6) {
      if (ppNVar2[1]->type != Expr) {
        return false;
      }
      if (((ppNVar2[1]->field_1).expr)->_id != ConstId) {
        return false;
      }
      if ((long)ppNVar3 - (long)ppNVar2 != 0x10) {
        pNVar5 = ppNVar2[2];
        goto LAB_006bbb23;
      }
      uVar7 = 2;
      goto LAB_006bbbc9;
    }
  }
  else {
    if (IVar1 != BinaryId) {
      if (IVar1 != UnaryId) {
        return false;
      }
      ppNVar2 = (node->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((node->values).
          super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppNVar2) {
        pNVar5 = *ppNVar2;
LAB_006bbb23:
        if (pNVar5->type != Expr) {
          return false;
        }
        return ((pNVar5->field_1).expr)->_id == ConstId;
      }
      uVar7 = 0;
      uVar6 = 0;
      goto LAB_006bbbc9;
    }
    ppNVar2 = (node->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppNVar3 = (node->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar6 = (long)ppNVar3 - (long)ppNVar2 >> 3;
    if (ppNVar3 == ppNVar2) goto LAB_006bbbd0;
    if ((*ppNVar2)->type != Expr) {
      return false;
    }
    if ((((*ppNVar2)->field_1).expr)->_id != ConstId) {
      return false;
    }
    if (1 < uVar6) {
      pNVar5 = ppNVar2[1];
      goto LAB_006bbb23;
    }
  }
  uVar7 = 1;
LAB_006bbbc9:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7,uVar6
            );
}

Assistant:

inline bool allInputsConstant(Node* node) {
  switch (node->type) {
    case Node::Type::Expr: {
      if (node->expr->is<Unary>()) {
        return node->getValue(0)->isConst();
      } else if (node->expr->is<Binary>()) {
        return node->getValue(0)->isConst() && node->getValue(1)->isConst();
      } else if (node->expr->is<Select>()) {
        return node->getValue(0)->isConst() && node->getValue(1)->isConst() &&
               node->getValue(2)->isConst();
      }
      break;
    }
    case Node::Type::Phi: {
      // Check if any of the others are not equal
      for (Index i = 1; i < node->values.size(); i++) {
        if (!node->getValue(i)->isConst()) {
          return false;
        }
      }
      return true;
    }
    default: {}
  }
  return false;
}